

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcSaucy.c
# Opt level: O3

int check_OPP_for_Boolean_matching(saucy *s,coloring *c)

{
  int iVar1;
  char *pcVar2;
  int *piVar3;
  int iVar4;
  long lVar5;
  long lVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  int local_3c;
  
  if ((&s->left != c) && (0 < s->n)) {
    piVar3 = (s->right).clen;
    iVar1 = 0;
    do {
      lVar6 = (long)iVar1;
      iVar4 = piVar3[lVar6];
      iVar8 = 0;
      iVar9 = 0;
      local_3c = 0;
      iVar7 = 0;
      if (-1 < iVar4) {
        lVar5 = lVar6 + -1;
        iVar7 = 0;
        local_3c = 0;
        iVar9 = 0;
        iVar8 = 0;
        do {
          pcVar2 = getVertexName(s->pNtk,(s->left).lab[lVar5 + 1]);
          if ((*pcVar2 != 'N') || (pcVar2[2] != ':')) {
            __assert_fail("name[0] == \'N\' && name[2] == \':\'",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abci/abcSaucy.c"
                          ,0x613,
                          "int check_OPP_for_Boolean_matching(struct saucy *, struct coloring *)");
          }
          if (pcVar2[1] == '2') {
            iVar9 = iVar9 + 1;
          }
          else {
            if (pcVar2[1] != '1') {
              __assert_fail("name[1] == \'2\'",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abci/abcSaucy.c"
                            ,0x617,
                            "int check_OPP_for_Boolean_matching(struct saucy *, struct coloring *)")
              ;
            }
            iVar8 = iVar8 + 1;
          }
          pcVar2 = getVertexName(s->pNtk,(s->right).lab[lVar5 + 1]);
          if ((*pcVar2 != 'N') || (pcVar2[2] != ':')) {
            __assert_fail("name[0] == \'N\' && name[2] == \':\'",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abci/abcSaucy.c"
                          ,0x61c,
                          "int check_OPP_for_Boolean_matching(struct saucy *, struct coloring *)");
          }
          if (pcVar2[1] == '2') {
            iVar7 = iVar7 + 1;
          }
          else {
            if (pcVar2[1] != '1') {
              __assert_fail("name[1] == \'2\'",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abci/abcSaucy.c"
                            ,0x620,
                            "int check_OPP_for_Boolean_matching(struct saucy *, struct coloring *)")
              ;
            }
            local_3c = local_3c + 1;
          }
          piVar3 = (s->right).clen;
          iVar4 = piVar3[lVar6];
          lVar5 = lVar5 + 1;
        } while (lVar5 < iVar1 + iVar4);
      }
      if (iVar8 != iVar7) {
        return 0;
      }
      if (iVar9 != local_3c) {
        return 0;
      }
      iVar1 = iVar1 + iVar4 + 1;
    } while (iVar1 < s->n);
  }
  return 1;
}

Assistant:

static int
check_OPP_for_Boolean_matching(struct saucy *s, struct coloring *c)
{
    int j, cell;
    int countN1Left, countN2Left;
    int countN1Right, countN2Right;
    char *name; 

    if (c == &s->left)
        return 1;       

    for (cell = 0; cell < s->n; cell += (s->right.clen[cell]+1)) {  
        countN1Left = countN2Left = countN1Right = countN2Right = 0;

        for (j = cell; j <= (cell+s->right.clen[cell]); j++) {

            name = getVertexName(s->pNtk, s->left.lab[j]);
            assert(name[0] == 'N' && name[2] == ':');
            if (name[1] == '1')
                countN1Left++;
            else {
                assert(name[1] == '2');
                countN2Left++;
            }

            name = getVertexName(s->pNtk, s->right.lab[j]);
            assert(name[0] == 'N' && name[2] == ':');
            if (name[1] == '1') 
                countN1Right++;
            else {
                assert(name[1] == '2');
                countN2Right++;
            }

        }

        if (countN1Left != countN2Right || countN2Left != countN1Right)
            return 0;
    }   
    
    return 1;
}